

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_componentWithImportAndChildren_Test::~Clone_componentWithImportAndChildren_Test
          (Clone_componentWithImportAndChildren_Test *this)

{
  Clone_componentWithImportAndChildren_Test *this_local;
  
  ~Clone_componentWithImportAndChildren_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, componentWithImportAndChildren)
{
    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();

    import->setUrl("some-other-model.xml");
    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);
    c->setSourceComponent(import, "my_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}